

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

bool CheckTag(HSQUIRRELVM v,SQREADFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)

{
  SQInteger SVar1;
  char *s;
  SQUnsignedInteger32 t;
  SQUnsignedInteger32 local_1c;
  
  SVar1 = (*read)(up,&local_1c,4);
  if (SVar1 == 4) {
    if (local_1c == tag) {
      return true;
    }
    s = "invalid or corrupted closure stream";
  }
  else {
    s = "io error, read function failure, the origin stream could be corrupted/trucated";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool CheckTag(HSQUIRRELVM v,SQREADFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)
{
    SQUnsignedInteger32 t;
    _CHECK_IO(SafeRead(v,read,up,&t,sizeof(t)));
    if(t != tag){
        v->Raise_Error(_SC("invalid or corrupted closure stream"));
        return false;
    }
    return true;
}